

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (a->num_bits < 0x10) {
    stbi__fill_bits(a);
  }
  uVar1 = a->code_buffer;
  uVar2 = z->fast[uVar1 & 0x1ff];
  if (uVar2 == 0) {
    uVar2 = (ushort)uVar1 << 8 | (ushort)uVar1 >> 8;
    uVar4 = (uVar2 & 0xf0f) << 4 | (uVar2 & 0xf0f0) >> 4;
    uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4;
    uVar4 = (uVar4 >> 1 & 0x5555) + (uVar4 & 0x5555) * 2;
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6 + 1;
    } while (z->maxcode[lVar6 + 10] <= (int)uVar4);
    uVar3 = 0xffffffff;
    if (lVar7 != 7) {
      lVar5 = (ulong)z->firstsymbol[lVar6 + 10] +
              ((ulong)(uVar4 >> (7U - (char)lVar7 & 0x1f)) - (ulong)z->firstcode[lVar6 + 10]);
      if ((ulong)*(byte *)((long)z + lVar5 + 0x484) - 9 != lVar7) {
        __assert_fail("z->size[b] == s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/stb/stb_image.h"
                      ,0xf98,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
      }
      a->code_buffer = uVar1 >> ((char)lVar6 + 10U & 0x1f);
      a->num_bits = (a->num_bits - (int)lVar7) + -9;
      uVar3 = (uint)*(ushort *)((long)z + lVar5 * 2 + 0x5a4);
    }
  }
  else {
    a->code_buffer = uVar1 >> ((byte)(uVar2 >> 9) & 0x1f);
    a->num_bits = a->num_bits - (uint)(uVar2 >> 9);
    uVar3 = uVar2 & 0x1ff;
  }
  return uVar3;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) stbi__fill_bits(a);
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}